

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbar_mugshot.cpp
# Opt level: O0

bool __thiscall FMugShot::SetState(FMugShot *this,char *state_name,bool wait_till_done,bool reset)

{
  FName local_44;
  char *local_40;
  char *dot;
  FMugShotState *local_30;
  FMugShotState *state;
  bool reset_local;
  char *pcStack_20;
  bool wait_till_done_local;
  char *state_name_local;
  FMugShot *this_local;
  
  state._6_1_ = reset;
  state._7_1_ = wait_till_done;
  pcStack_20 = state_name;
  state_name_local = (char *)this;
  FName::FName((FName *)((long)&dot + 4),state_name,true);
  local_30 = FindMugShotState((FName *)((long)&dot + 4));
  if (local_30 == (FMugShotState *)0x0) {
    local_40 = strchr(pcStack_20,0x2e);
    if (local_40 != (char *)0x0) {
      FName::FName(&local_44,pcStack_20,(long)local_40 - (long)pcStack_20,true);
      local_30 = FindMugShotState(&local_44);
    }
    if (local_30 == (FMugShotState *)0x0) {
      return false;
    }
  }
  this->bNormal = false;
  this->bOuchActive = false;
  if (local_30 == this->CurrentState) {
    if ((state._6_1_ & 1) == 0) {
      this_local._7_1_ = true;
    }
    else {
      FMugShotState::Reset(local_30);
      this_local._7_1_ = true;
    }
  }
  else if ((((state._7_1_ & 1) == 0) || (this->CurrentState == (FMugShotState *)0x0)) ||
          ((*(byte *)this->CurrentState >> 4 & 1) != 0)) {
    this->CurrentState = local_30;
    FMugShotState::Reset(local_30);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FMugShot::SetState(const char *state_name, bool wait_till_done, bool reset)
{
	// Search for full name.
	FMugShotState *state = FindMugShotState(FName(state_name, true));
	if (state == NULL)
	{
		// Search for initial name, if the full one contains a dot.
		const char *dot = strchr(state_name, '.');
		if (dot != NULL)
		{
			state = FindMugShotState(FName(state_name, dot - state_name, true));
		}
		if (state == NULL)
		{
			// Requested state does not exist, so do nothing.
			return false;
		}
	}
	bNormal = false; //Assume we are not setting god or normal for now.
	bOuchActive = false;
	if (state != CurrentState)
	{
		if (!wait_till_done || CurrentState == NULL || CurrentState->bFinished)
		{
			CurrentState = state;
			state->Reset();
			return true;
		}
		return false;
	}
	else if(reset)
	{
		state->Reset();
		return true;
	}
	return true;
}